

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::HlslParseContext::handleConstructor
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *node,TType *type)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermAggregate *pTVar4;
  TIntermTyped *pTVar5;
  undefined4 extraout_var_02;
  TIntermSymbol *left;
  TIntermBinary *right;
  TIntermAggregate *initializer;
  HlslParseContext *this_00;
  
  if (node == (TIntermTyped *)0x0) {
    node = (TIntermTyped *)0x0;
  }
  else {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
    bVar2 = TType::operator==(type,(TType *)CONCAT44(extraout_var,iVar3));
    if (!bVar2) {
      this_00 = (HlslParseContext *)type;
      iVar3 = (*type->_vptr_TType[0x25])();
      if (((char)iVar3 == '\0') ||
         (bVar2 = isScalarConstructor(this_00,&node->super_TIntermNode), !bVar2)) {
        pTVar5 = addConstructor(this,loc,node,type);
        return pTVar5;
      }
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
      if ((CONCAT44(extraout_var_00,iVar3) == 0) &&
         (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node),
         CONCAT44(extraout_var_01,iVar3) == 0)) {
        pTVar4 = TIntermediate::makeAggregate
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc);
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        left = makeInternalVariableNode
                         (this,loc,"scalarCopy",(TType *)CONCAT44(extraout_var_02,iVar3));
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        right = TIntermediate::addBinaryNode(pTVar1,EOpAssign,&left->super_TIntermTyped,node,loc);
        pTVar4 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)pTVar4,(TIntermNode *)right);
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        initializer = TIntermediate::makeAggregate(pTVar1,loc);
        pTVar5 = convertInitializerList
                           (this,loc,type,(TIntermTyped *)initializer,&left->super_TIntermTyped);
        pTVar4 = TIntermediate::growAggregate
                           (pTVar1,(TIntermNode *)pTVar4,&pTVar5->super_TIntermNode);
        (pTVar4->super_TIntermOperator).op = EOpComma;
        (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(pTVar4,type);
        return (TIntermTyped *)pTVar4;
      }
      pTVar4 = TIntermediate::makeAggregate
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc);
      pTVar5 = convertInitializerList(this,loc,type,(TIntermTyped *)pTVar4,node);
      return pTVar5;
    }
  }
  return node;
}

Assistant:

TIntermTyped* HlslParseContext::handleConstructor(const TSourceLoc& loc, TIntermTyped* node, const TType& type)
{
    if (node == nullptr)
        return nullptr;

    // Construct identical type
    if (type == node->getType())
        return node;

    // Handle the idiom "(struct type)<scalar value>"
    if (type.isStruct() && isScalarConstructor(node)) {
        // 'node' will almost always get used multiple times, so should not be used directly,
        // it would create a DAG instead of a tree, which might be okay (would
        // like to formalize that for constants and symbols), but if it has
        // side effects, they would get executed multiple times, which is not okay.
        if (node->getAsConstantUnion() == nullptr && node->getAsSymbolNode() == nullptr) {
            TIntermAggregate* seq = intermediate.makeAggregate(loc);
            TIntermSymbol* copy = makeInternalVariableNode(loc, "scalarCopy", node->getType());
            seq = intermediate.growAggregate(seq, intermediate.addBinaryNode(EOpAssign, copy, node, loc));
            seq = intermediate.growAggregate(seq, convertInitializerList(loc, type, intermediate.makeAggregate(loc), copy));
            seq->setOp(EOpComma);
            seq->setType(type);
            return seq;
        } else
            return convertInitializerList(loc, type, intermediate.makeAggregate(loc), node);
    }

    return addConstructor(loc, node, type);
}